

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::GoniometricLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pbrt::Image,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,GoniometricLight *p,Transform *args,
          MediumHandle *args_1,SpectrumHandle *args_2,float *args_3,Image *args_4,
          polymorphic_allocator<std::byte> *args_5)

{
  Float scale;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_e0;
  MediumInterface local_d8;
  Image local_c8;
  
  local_d8.inside =
       (MediumHandle)
       (args_1->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  local_e0.bits =
       (args_2->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  scale = *args_3;
  local_d8.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = local_d8.inside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  pbrt::Image::Image(&local_c8,args_4);
  pbrt::GoniometricLight::GoniometricLight
            (p,args,&local_d8,(SpectrumHandle *)&local_e0,scale,&local_c8,args_5->memoryResource);
  pbrt::Image::~Image(&local_c8);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }